

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::HasExtraArrayness
          (InterfaceVariableScalarReplacement *this,Instruction *entry_point,Instruction *var)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t id;
  StorageClass SVar3;
  IRContext *this_00;
  DecorationManager *this_01;
  ExecutionModel execution_model;
  Instruction *var_local;
  Instruction *entry_point_local;
  InterfaceVariableScalarReplacement *this_local;
  
  uVar2 = opt::Instruction::GetSingleWordInOperand(entry_point,0);
  if ((uVar2 == 2) || (uVar2 == 1)) {
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_decoration_mgr(this_00);
    id = opt::Instruction::result_id(var);
    bVar1 = analysis::DecorationManager::HasDecoration(this_01,id,0xf);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if (uVar2 == 1) {
      this_local._7_1_ = true;
    }
    else {
      SVar3 = anon_unknown_0::GetStorageClass(var);
      this_local._7_1_ = SVar3 != Output;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InterfaceVariableScalarReplacement::HasExtraArrayness(
    Instruction& entry_point, Instruction* var) {
  spv::ExecutionModel execution_model =
      static_cast<spv::ExecutionModel>(entry_point.GetSingleWordInOperand(0));
  if (execution_model != spv::ExecutionModel::TessellationEvaluation &&
      execution_model != spv::ExecutionModel::TessellationControl) {
    return false;
  }
  if (!context()->get_decoration_mgr()->HasDecoration(
          var->result_id(), uint32_t(spv::Decoration::Patch))) {
    if (execution_model == spv::ExecutionModel::TessellationControl)
      return true;
    return GetStorageClass(var) != spv::StorageClass::Output;
  }
  return false;
}